

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffdtdmll(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,LONGLONG *naxes,
            int *status)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int *in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  double dVar4;
  double doublesize;
  tcolumn *colptr;
  char message [81];
  char *lastloc;
  char *loc;
  LONGLONG totalpix;
  LONGLONG dimsize;
  char local_a8 [88];
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  long lVar5;
  fitsfile *in_stack_ffffffffffffffc8;
  int local_4;
  
  lVar5 = 1;
  if (*(int *)colptr->ttype < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffffc8,0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    if ((in_EDX < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_EDX)) {
      colptr->ttype[0] = '.';
      colptr->ttype[1] = '\x01';
      colptr->ttype[2] = '\0';
      colptr->ttype[3] = '\0';
      local_4 = 0x12e;
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_EDX + -1) * 0xa0;
      if (*in_RSI == '\0') {
        *in_R8 = 1;
        if (0 < in_ECX) {
          *in_R9 = *(undefined8 *)(lVar1 + 0x58);
        }
      }
      else {
        *in_R8 = 0;
        pcVar2 = strchr(in_RSI,0x28);
        if (pcVar2 == (char *)0x0) {
          snprintf(local_a8,0x51,"Illegal TDIM keyword value: %s",in_RSI);
          colptr->ttype[0] = '\a';
          colptr->ttype[1] = '\x01';
          colptr->ttype[2] = '\0';
          colptr->ttype[3] = '\0';
          return 0x107;
        }
        while (pcVar2 != (char *)0x0) {
          in_stack_ffffffffffffffb0 = (int *)(pcVar2 + 1);
          dVar4 = strtod((char *)in_stack_ffffffffffffffb0,(char **)&stack0xffffffffffffffb8);
          lVar3 = (long)(dVar4 + 0.1);
          if (*in_R8 < in_ECX) {
            in_R9[*in_R8] = lVar3;
          }
          if (lVar3 < 0) {
            ffpmsg((char *)0x1c9ef2);
            ffpmsg((char *)0x1c9eff);
            colptr->ttype[0] = '\a';
            colptr->ttype[1] = '\x01';
            colptr->ttype[2] = '\0';
            colptr->ttype[3] = '\0';
            return 0x107;
          }
          lVar5 = lVar3 * lVar5;
          *in_R8 = *in_R8 + 1;
          pcVar2 = strchr((char *)in_stack_ffffffffffffffb0,0x2c);
        }
        pcVar2 = strchr((char *)in_stack_ffffffffffffffb0,0x29);
        if (pcVar2 == (char *)0x0) {
          snprintf(local_a8,0x51,"Illegal TDIM keyword value: %s",in_RSI);
          colptr->ttype[0] = '\a';
          colptr->ttype[1] = '\x01';
          colptr->ttype[2] = '\0';
          colptr->ttype[3] = '\0';
          return 0x107;
        }
        if ((0 < *(int *)(lVar1 + 0x50)) && (*(long *)(lVar1 + 0x58) != lVar5)) {
          snprintf(local_a8,0x51,"column vector length, %.0f, does not equal TDIMn array size, %.0f"
                   ,(double)*(long *)(lVar1 + 0x58),(double)lVar5);
          ffpmsg((char *)0x1ca00b);
          ffpmsg((char *)0x1ca018);
          colptr->ttype[0] = '\a';
          colptr->ttype[1] = '\x01';
          colptr->ttype[2] = '\0';
          colptr->ttype[3] = '\0';
          return 0x107;
        }
      }
      local_4 = *(int *)colptr->ttype;
    }
  }
  else {
    local_4 = *(int *)colptr->ttype;
  }
  return local_4;
}

Assistant:

int ffdtdmll(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
*/
{
    LONGLONG dimsize;
    LONGLONG totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr;
    double doublesize;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
    {
        *naxis = 1;                   /* default = 1 dimensional */
        if (maxdim > 0)
            naxes[0] = colptr->trepeat; /* default length = repeat */
    }
    else
    {
        *naxis = 0;

        loc = strchr(tdimstr, '(' );  /* find the opening quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        while (loc)
        {
            loc++;

    /* Read value as a double because the string to 64-bit int function is  */
    /* platform dependent (strtoll, strtol, _atoI64).  This still gives     */
    /* about 48 bits of precision, which is plenty for this purpose.        */

            doublesize = strtod(loc, &loc);
            dimsize = (LONGLONG) (doublesize + 0.1);

            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
        }

        loc = strchr(lastloc, ')' );  /* check for the closing quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        if ((colptr->tdatatype > 0) && (colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %.0f, does not equal TDIMn array size, %.0f",
          (double) (colptr->trepeat), (double) totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}